

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  uint uVar1;
  LogMessage *pLVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int i;
  ulong uVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar1 = (this->location_->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1f1);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
    uVar1 = (this->location_->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 2) != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1f2);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_61,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (leading->_M_string_length != 0) {
    psVar3 = SourceCodeInfo_Location::_internal_mutable_leading_comments_abi_cxx11_(this->location_)
    ;
    std::__cxx11::string::swap((string *)psVar3);
  }
  if (trailing->_M_string_length != 0) {
    psVar3 = SourceCodeInfo_Location::_internal_mutable_trailing_comments_abi_cxx11_
                       (this->location_);
    std::__cxx11::string::swap((string *)psVar3);
  }
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(detached_comments->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(detached_comments->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    pbVar4 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Add(&this->location_->leading_detached_comments_);
    std::__cxx11::string::swap((string *)pbVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(detached_comments);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}